

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  void **ppvVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar5;
  int __old_val;
  
  iVar1 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar3 = rep(this);
    uVar2 = pRVar3->allocated_size;
  }
  if (iVar1 < (int)uVar2) {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    ppvVar4 = element_at(this,iVar1);
    pVVar5 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
              *)*ppvVar4;
  }
  else {
    pVVar5 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
              *)0x0;
  }
  return pVVar5;
}

Assistant:

Value<TypeHandler>* AddFromCleared() {
    if (current_size_ < allocated_size()) {
      return cast<TypeHandler>(
          element_at(ExchangeCurrentSize(current_size_ + 1)));
    } else {
      return nullptr;
    }
  }